

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_isotropic(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *hh)

{
  REF_NODE ref_node;
  bool bVar1;
  uint uVar2;
  REF_DBL *metric_00;
  double *pdVar3;
  undefined8 uVar4;
  REF_DBL *m;
  REF_DBL *pRVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL d_imply [12];
  REF_DBL d_met [12];
  uint local_134;
  double local_f8;
  double local_f0;
  REF_DBL local_98;
  double local_90 [12];
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xda1,
           "ref_metric_isotropic","malloc metric_imply of REF_DBL negative");
    local_134 = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xda1,"ref_metric_isotropic","malloc metric_imply of REF_DBL NULL");
      local_134 = 2;
    }
    else {
      local_134 = ref_metric_imply_from(metric_00,ref_grid);
      if (local_134 == 0) {
        if (0 < ref_node->max) {
          pRVar5 = hh + 1;
          lVar7 = 0;
          local_134 = 0;
          m = metric_00;
          do {
            if (-1 < ref_node->global[lVar7]) {
              uVar2 = ref_matrix_diag_m(m,&local_f8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xda8,"ref_metric_isotropic",(ulong)uVar2,"eigen decomp");
                local_134 = uVar2;
                goto LAB_001decee;
              }
              dVar9 = local_f8;
              if (local_f8 <= local_f0) {
                dVar9 = local_f0;
              }
              if (0.0 <= dVar9) {
                dVar10 = SQRT(dVar9);
                dVar8 = dVar10;
                if (0.0 > dVar9) {
                  dVar8 = sqrt(dVar9);
                }
                if (dVar9 < 0.0) {
                  dVar10 = sqrt(dVar9);
                }
                if (dVar10 * *(double *)(&DAT_0022f390 + (ulong)(0.0 < dVar8 * 1e+20) * 8) <= 1.0) {
                  uVar4 = 0xdac;
                  goto LAB_001dede1;
                }
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                dVar8 = local_f8;
                if (local_f0 <= local_f8) {
                  dVar8 = local_f0;
                }
                if (dVar8 < 0.0) {
                  uVar4 = 0xdb1;
                  goto LAB_001ded22;
                }
                dVar11 = SQRT(dVar8);
                dVar10 = dVar11;
                if (dVar8 < 0.0) {
                  dVar10 = sqrt(dVar8);
                }
                if (dVar8 < 0.0) {
                  dVar11 = sqrt(dVar8);
                }
                if (dVar11 * *(double *)(&DAT_0022f390 + (ulong)(0.0 < dVar10 * 1e+20) * 8) <= 1.0)
                {
                  uVar4 = 0xdb2;
LAB_001dede1:
                  pcVar6 = "div zero";
                  goto LAB_001dedef;
                }
                if (dVar8 < 0.0) {
                  dVar8 = sqrt(dVar8);
                }
                else {
                  dVar8 = SQRT(dVar8);
                }
                dVar9 = 1.0 / dVar9;
                dVar10 = (1.0 / dVar8) * 1e+20;
                if (dVar10 <= -dVar10) {
                  dVar10 = -dVar10;
                }
                dVar11 = dVar9;
                if (dVar9 <= -dVar9) {
                  dVar11 = -dVar9;
                }
                if (dVar10 <= dVar11) {
                  uVar4 = 0xdb5;
                  goto LAB_001dede1;
                }
                uVar2 = ref_matrix_diag_m(metric,&local_98);
                if (uVar2 == 0) {
                  uVar2 = ref_matrix_descending_eig(&local_98);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xdb9,"ref_metric_isotropic",(ulong)uVar2,"really descend?");
                    local_134 = uVar2;
                    goto LAB_001decee;
                  }
                  pdVar3 = local_90;
                  if (0.5 <= dVar9 / (1.0 / dVar8)) {
                    pdVar3 = &local_98;
                  }
                  dVar9 = *pdVar3;
                  if (dVar9 < 0.0) {
                    uVar4 = 0xdbf;
                    goto LAB_001ded22;
                  }
                  dVar10 = SQRT(dVar9);
                  dVar8 = dVar10;
                  if (dVar9 < 0.0) {
                    dVar8 = sqrt(dVar9);
                  }
                  if (dVar9 < 0.0) {
                    dVar10 = sqrt(dVar9);
                  }
                  if (dVar10 * *(double *)(&DAT_0022f390 + (ulong)(0.0 < dVar8 * 1e+20) * 8) <= 1.0)
                  {
                    uVar4 = 0xdc0;
                    goto LAB_001dede1;
                  }
                  if (dVar9 < 0.0) {
                    dVar9 = sqrt(dVar9);
                  }
                  else {
                    dVar9 = SQRT(dVar9);
                  }
                  pRVar5[-1] = 1.0 / dVar9;
                  *pRVar5 = 0.5;
                  bVar1 = true;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xdb8,"ref_metric_isotropic",(ulong)uVar2,"eigen decomp");
                  local_134 = uVar2;
LAB_001decee:
                  bVar1 = false;
                }
              }
              else {
                uVar4 = 0xdab;
LAB_001ded22:
                pcVar6 = "neg eig";
LAB_001dedef:
                bVar1 = false;
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,uVar4,"ref_metric_isotropic",pcVar6);
                local_134 = 1;
              }
              if (!bVar1) {
                return local_134;
              }
            }
            lVar7 = lVar7 + 1;
            metric = metric + 6;
            m = m + 6;
            pRVar5 = pRVar5 + 2;
          } while (lVar7 < ref_node->max);
        }
        local_134 = ref_node_ghost_dbl(ref_node,hh,2);
        if (local_134 == 0) {
          free(metric_00);
          local_134 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xdc7,"ref_metric_isotropic",(ulong)local_134,"update ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xda2,"ref_metric_isotropic",(ulong)local_134,"imply");
      }
    }
  }
  return local_134;
}

Assistant:

REF_FCN REF_STATUS ref_metric_isotropic(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *hh) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL *metric_imply;
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL e, d_imply[12], hmin, hmax, d_met[12], h;
    REF_DBL ar;

    RSS(ref_matrix_diag_m(&(metric_imply[6 * node]), d_imply), "eigen decomp");
    e = MAX(MAX(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmin = 1.0 / sqrt(e);

    e = MIN(MIN(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmax = 1.0 / sqrt(e);

    RAS(ref_math_divisible(hmin, hmax), "div zero");
    ar = hmin / hmax;

    RSS(ref_matrix_diag_m(&(metric[6 * node]), d_met), "eigen decomp");
    RSS(ref_matrix_descending_eig(d_met), "really descend?");
    if (ar < 0.5) {
      e = ref_matrix_eig(d_met, 1);
    } else {
      e = ref_matrix_eig(d_met, 0);
    }
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    h = 1.0 / sqrt(e);

    hh[0 + 2 * node] = h;
    hh[1 + 2 * node] = 0.5; /* CADENCE/Pointwise typical decay rate */
  }

  RSS(ref_node_ghost_dbl(ref_node, hh, 2), "update ghosts");

  ref_free(metric_imply);

  return REF_SUCCESS;
}